

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

void __thiscall Arcflow::final_compression_step(Arcflow *this)

{
  pointer ppVar1;
  int iVar2;
  int *v;
  long lVar3;
  pointer piVar4;
  runtime_error *prVar5;
  int iVar6;
  pointer ppVar7;
  long lVar8;
  long lVar9;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> lbl;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  adj;
  NodeSet NStmp;
  vector<int,_std::allocator<int>_> order;
  allocator_type local_1d1;
  NodeSet *local_1d0;
  vector<int,_std::allocator<int>_> local_1c8;
  vector<int,_std::allocator<int>_> local_1b0;
  adj_list local_198;
  NodeSet local_180;
  vector<int,_std::allocator<int>_> local_138 [11];
  
  if (this->ready != false) {
    snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x17e);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,(char *)local_138);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1d0 = &this->NS;
  iVar2 = NodeSet::size(local_1d0);
  std::vector<int,_std::allocator<int>_>::vector(&local_1c8,(long)iVar2,(allocator_type *)local_138)
  ;
  get_adj(&local_198,iVar2,&this->A,true);
  local_180.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_180.index._M_t._M_impl.super__Rb_tree_header._M_header;
  local_180.index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_180.index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_180.index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_180.labels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_180.labels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180.labels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = 0;
  local_180.index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_180.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    iVar2 = NodeSet::size(local_1d0);
    if (iVar2 <= lVar9) {
      std::
      _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::operator=((_Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   *)local_1d0,
                  (_Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   *)&local_180);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator=(&(this->NS).labels,&local_180.labels);
      NodeSet::topological_order(local_138,local_1d0);
      if (local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        piVar4 = local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          *piVar4 = *(int *)(CONCAT44(local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start._0_4_) +
                            (long)*piVar4 * 4);
          piVar4 = piVar4 + 1;
        } while (piVar4 != local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      relabel_graph(this,&local_1c8);
      NodeSet::sort(local_1d0);
      if ((void *)CONCAT44(local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_180.labels);
      std::
      _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   *)&local_180);
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::~vector(&local_198);
      if (local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
    local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_1b0,(long)this->label_size,(value_type *)local_138,&local_1d1);
    ppVar1 = local_198.
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar9].
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppVar7 = local_198.
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar9].
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar1; ppVar7 = ppVar7 + 1) {
      if (lVar9 <= ppVar7->first) {
        snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "pa.first < u",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                 ,0x187);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,(char *)local_138);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar2 = ppVar7->second;
      NodeSet::get_label(local_138,&local_180,
                         local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[ppVar7->first]);
      iVar6 = (this->inst).ndims;
      if (0 < iVar6) {
        lVar3 = *(long *)&(this->weights).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar2].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        lVar8 = 0;
        do {
          iVar6 = *(int *)(lVar3 + lVar8 * 4) +
                  *(int *)(CONCAT44(local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar8 * 4);
          if (iVar6 < local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8]) {
            iVar6 = local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8];
          }
          local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar8] = iVar6;
          lVar8 = lVar8 + 1;
          iVar6 = (this->inst).ndims;
        } while (lVar8 < iVar6);
      }
      if ((this->inst).binary != false) {
        lVar3 = (long)iVar6;
        if (iVar2 == this->LOSS) {
          iVar2 = *(int *)(CONCAT44(local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar3 * 4);
          if (iVar2 < local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar3]) {
            iVar2 = local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar3];
          }
        }
        else {
          iVar6 = *(int *)(CONCAT44(local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar3 * 4);
          if (iVar2 < iVar6) {
            iVar2 = iVar6;
          }
          if (iVar2 < local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar3]) {
            iVar2 = local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar3];
          }
        }
        local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar3] = iVar2;
      }
      if ((void *)CONCAT44(local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_));
      }
    }
    iVar2 = NodeSet::get_index(&local_180,&local_1b0);
    local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar9] = iVar2;
    if (local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void Arcflow::final_compression_step() {
	throw_assert(ready == false);
	int nv = NS.size();
	std::vector<int> labels(nv);
	std::vector<std::vector<int_pair>> adj = get_adj(nv, A, TRANSPOSE);

	NodeSet NStmp;
	for (int u = 0; u < NS.size(); u++) {
		std::vector<int> lbl(label_size, 0);
		for (const auto &pa : adj[u]) {
			throw_assert(pa.first < u);
			int v = labels[pa.first];
			int it = pa.second;
			const std::vector<int> &lv = NStmp.get_label(v);
			for (int d = 0; d < inst.ndims; d++) {
				lbl[d] = std::max(lbl[d], lv[d] + weights[it][d]);
			}
			if (inst.binary) {
				if (it == LOSS) {
					lbl[inst.ndims] = std::max(lbl[inst.ndims],
											   lv[inst.ndims]);
				} else {
					lbl[inst.ndims] = std::max(lbl[inst.ndims],
											   std::max(lv[inst.ndims], it));
				}
			}
		}
		labels[u] = NStmp.get_index(lbl);
	}

	NS = NStmp;
	std::vector<int> order = NS.topological_order();
	for (int &v : labels) {
		v = order[v];
	}
	relabel_graph(labels);
	NS.sort();
}